

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MCU::quantify(MCU *this)

{
  int local_24;
  int local_20;
  int j;
  int i;
  int w;
  int h;
  int id;
  MCU *this_local;
  
  for (w = 1; w < 4; w = w + 1) {
    for (i = 0; i < (int)(uint)subVector[w].height; i = i + 1) {
      for (j = 0; j < (int)(uint)subVector[w].width; j = j + 1) {
        for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
          for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
            this->mcu[w][i][j][local_20][local_24] =
                 (double)quantTable[subVector[w].quant][local_20 * 8 + local_24] *
                 this->mcu[w][i][j][local_20][local_24];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void quantify() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] *= quantTable[subVector[id].quant][i*8 + j];
                        }
                    }
                }
            }
        }
    }